

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::ReLU_x86_fma::forward_inplace(ReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  float *pfVar7;
  long *in_RSI;
  long *in_RDI;
  __m128 _neg_1;
  __m128 _pos_1;
  __m128 _p_3;
  __m128 _slope;
  __m128 _zero_1;
  __m256 _neg;
  __m256 _pos;
  __m256 _p_2;
  __m256 _slope_avx;
  __m256 _zero_avx_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p_1;
  __m128 _zero;
  __m256 _p;
  __m256 _zero_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_1;
  Mat *m;
  int local_7e4;
  undefined8 local_7b0;
  undefined8 uStackY_7a8;
  undefined8 local_740;
  undefined8 uStackY_738;
  undefined8 uStackY_730;
  undefined8 uStackY_728;
  Option *in_stack_fffffffffffff8f0;
  Mat *in_stack_fffffffffffff8f8;
  ReLU_x86_fma *in_stack_fffffffffffff900;
  int local_6dc;
  undefined1 (*local_690) [32];
  int local_688;
  float local_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  int local_618;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined4 local_5f0;
  long local_5e8;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined8 local_5c8;
  undefined1 (*local_5c0) [32];
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  long *local_590;
  int local_57c;
  undefined1 local_555;
  int local_554;
  undefined8 *local_548;
  undefined8 *local_538;
  undefined8 *local_520;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 (*local_4a8) [32];
  undefined1 local_460 [32];
  undefined1 (*local_428) [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined1 (*local_378) [32];
  undefined1 local_350 [16];
  undefined1 (*local_338) [32];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  long local_1a0;
  undefined4 local_194;
  long local_190;
  undefined1 (*local_188) [32];
  undefined4 local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  undefined4 local_11c;
  long local_118;
  undefined8 *local_d8;
  
  if ((int)in_RSI[3] == 0) {
    local_7e4 = 0;
  }
  else {
    local_7e4 = (int)((long)((ulong)(uint)((int)(in_RSI[2] << 3) >> 0x1f) << 0x20 |
                            in_RSI[2] << 3 & 0xffffffffU) / (long)(int)in_RSI[3]);
  }
  local_59c = local_7e4;
  if (local_7e4 == 8) {
    local_57c = forward_inplace_int8
                          (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                           in_stack_fffffffffffff8f0);
  }
  else {
    local_5a0 = *(int *)((long)in_RSI + 0x2c);
    local_5a4 = (int)in_RSI[6];
    local_5a8 = *(int *)((long)in_RSI + 0x34);
    local_5ac = (int)in_RSI[7];
    local_5b0 = (int)in_RSI[3];
    local_5b4 = local_5a0 * local_5a4 * local_5a8 * local_5b0;
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      for (local_688 = 0; local_688 < local_5ac; local_688 = local_688 + 1) {
        local_690 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_688 * in_RSI[2]);
        local_6dc = 0;
        uVar2 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar3 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar2),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar2),0x30);
        auVar4 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar2),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar2),0x30);
        for (; local_6dc + 7 < local_5b4; local_6dc = local_6dc + 8) {
          auVar5 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*local_690);
          auVar6 = vminps_avx(ZEXT1632(ZEXT816(0)),*local_690);
          local_240 = auVar4._0_4_;
          fStack_23c = auVar4._4_4_;
          fStack_238 = auVar4._8_4_;
          fStack_234 = auVar4._12_4_;
          fStack_230 = auVar3._0_4_;
          fStack_22c = auVar3._4_4_;
          fStack_228 = auVar3._8_4_;
          fStack_224 = auVar3._12_4_;
          local_260 = auVar6._0_4_;
          fStack_25c = auVar6._4_4_;
          fStack_258 = auVar6._8_4_;
          fStack_254 = auVar6._12_4_;
          fStack_250 = auVar6._16_4_;
          fStack_24c = auVar6._20_4_;
          fStack_248 = auVar6._24_4_;
          local_280 = auVar5._0_4_;
          fStack_27c = auVar5._4_4_;
          fStack_278 = auVar5._8_4_;
          fStack_274 = auVar5._12_4_;
          fStack_270 = auVar5._16_4_;
          fStack_26c = auVar5._20_4_;
          fStack_268 = auVar5._24_4_;
          fStack_264 = auVar5._28_4_;
          local_740 = CONCAT44(fStack_27c + fStack_23c * fStack_25c,
                               local_280 + local_240 * local_260);
          uStackY_738 = CONCAT44(fStack_274 + fStack_234 * fStack_254,
                                 fStack_278 + fStack_238 * fStack_258);
          uStackY_730 = CONCAT44(fStack_26c + fStack_22c * fStack_24c,
                                 fStack_270 + fStack_230 * fStack_250);
          uStackY_728 = CONCAT44(fStack_264 + fStack_224,fStack_268 + fStack_228 * fStack_248);
          *(undefined8 *)*local_690 = local_740;
          *(undefined8 *)(*local_690 + 8) = uStackY_738;
          *(undefined8 *)(*local_690 + 0x10) = uStackY_730;
          *(undefined8 *)(*local_690 + 0x18) = uStackY_728;
          local_690 = local_690 + 1;
        }
        fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        for (; local_6dc + 3 < local_5b4; local_6dc = local_6dc + 4) {
          auVar3 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_690);
          auVar4 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_690);
          local_1c0 = auVar4._0_4_;
          fStack_1bc = auVar4._4_4_;
          fStack_1b8 = auVar4._8_4_;
          fStack_1b4 = auVar4._12_4_;
          local_1d0 = auVar3._0_4_;
          fStack_1cc = auVar3._4_4_;
          fStack_1c8 = auVar3._8_4_;
          fStack_1c4 = auVar3._12_4_;
          local_7b0 = CONCAT44(fStack_1cc + fVar1 * fStack_1bc,local_1d0 + fVar1 * local_1c0);
          uStackY_7a8 = CONCAT44(fStack_1c4 + fVar1 * fStack_1b4,fStack_1c8 + fVar1 * fStack_1b8);
          *(undefined8 *)*local_690 = local_7b0;
          *(undefined8 *)(*local_690 + 8) = uStackY_7a8;
          local_690 = (undefined1 (*) [32])(*local_690 + 0x10);
        }
        for (; local_6dc < local_5b4; local_6dc = local_6dc + 1) {
          if (*(float *)*local_690 < 0.0) {
            *(float *)*local_690 =
                 *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * *(float *)*local_690
            ;
          }
          local_690 = (undefined1 (*) [32])(*local_690 + 4);
        }
      }
    }
    else {
      local_590 = in_RSI;
      for (local_5b8 = 0; local_5b8 < local_5ac; local_5b8 = local_5b8 + 1) {
        local_548 = &local_608;
        local_174 = *(int *)((long)local_590 + 0x2c);
        local_178 = (int)local_590[6];
        local_17c = *(undefined4 *)((long)local_590 + 0x34);
        local_188 = (undefined1 (*) [32])
                    (*local_590 + local_590[8] * (long)local_5b8 * local_590[2]);
        local_190 = local_590[2];
        local_194 = (undefined4)local_590[3];
        local_1a0 = local_590[4];
        local_170 = &local_608;
        local_118 = (long)local_174 * (long)local_178 * local_190;
        local_538 = &local_608;
        local_520 = &local_608;
        local_11c = 0x10;
        local_554 = local_5b8;
        local_555 = 1;
        local_608 = 0;
        local_5f8 = 0;
        local_5f0 = 0;
        local_5e0 = 0;
        local_5dc = 0;
        local_5d8 = 0;
        local_5d4 = 0;
        local_5d0 = 0;
        local_5c8 = 0;
        local_600 = 0;
        local_4e0 = 0;
        uStack_4d8 = 0;
        uStack_4d0 = 0;
        uStack_4c8 = 0;
        local_640 = 0;
        uStack_638 = 0;
        uStack_630 = 0;
        uStack_628 = 0;
        local_5c0 = local_188;
        for (local_618 = 0; local_618 + 7 < local_5b4; local_618 = local_618 + 8) {
          local_4a8 = local_5c0;
          local_660 = *(undefined8 *)*local_5c0;
          uStack_658 = *(undefined8 *)(*local_5c0 + 8);
          uStack_650 = *(undefined8 *)(*local_5c0 + 0x10);
          uStack_648 = *(undefined8 *)(*local_5c0 + 0x18);
          local_428 = local_5c0;
          local_3c0 = 0;
          uStack_3b8 = 0;
          uStack_3b0 = 0;
          uStack_3a8 = 0;
          local_460 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*local_5c0);
          *(undefined8 *)*local_5c0 = local_460._0_8_;
          *(undefined8 *)(*local_5c0 + 8) = local_460._8_8_;
          *(undefined8 *)(*local_5c0 + 0x10) = local_460._16_8_;
          *(undefined8 *)(*local_5c0 + 0x18) = local_460._24_8_;
          local_5c0 = local_5c0 + 1;
          local_3e0 = local_660;
          uStack_3d8 = uStack_658;
          uStack_3d0 = uStack_650;
          uStack_3c8 = uStack_648;
        }
        local_390 = 0;
        uStack_388 = 0;
        local_670 = 0;
        uStack_668 = 0;
        for (; local_d8 = local_520, local_5e8 = local_1a0, local_618 + 3 < local_5b4;
            local_618 = local_618 + 4) {
          local_378 = local_5c0;
          local_680 = *(undefined8 *)*local_5c0;
          uStack_678 = *(undefined8 *)(*local_5c0 + 8);
          local_338 = local_5c0;
          local_300 = 0;
          uStack_2f8 = 0;
          local_350 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_5c0);
          *(undefined8 *)*local_5c0 = local_350._0_8_;
          *(undefined8 *)(*local_5c0 + 8) = local_350._8_8_;
          local_5c0 = (undefined1 (*) [32])(*local_5c0 + 0x10);
          local_310 = local_680;
          uStack_308 = uStack_678;
        }
        for (; local_618 < local_5b4; local_618 = local_618 + 1) {
          local_684 = 0.0;
          pfVar7 = std::max<float>((float *)local_5c0,&local_684);
          *(float *)*local_5c0 = *pfVar7;
          local_5c0 = (undefined1 (*) [32])(*local_5c0 + 4);
        }
      }
    }
    local_57c = 0;
  }
  return local_57c;
}

Assistant:

int ReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}